

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

csv<double> *
argagg::convert::converter<argagg::csv<double>_>::convert
          (csv<double> *__return_storage_ptr__,char *s)

{
  bool bVar1;
  double value;
  char *s_local;
  
  (__return_storage_ptr__->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  s_local = s;
  while( true ) {
    bVar1 = parse_next_component<double>(&s_local,&value,',');
    if (!bVar1) break;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&__return_storage_ptr__->values,&value);
  }
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&__return_storage_ptr__->values,&value);
  return __return_storage_ptr__;
}

Assistant:

csv<T>
converter<csv<T>>::convert(const char* s)
{
  csv<T> result {{}};
  T value;
  while (parse_next_component(s, value, ',')) {
    result.values.emplace_back(std::move(value));
  }
  result.values.emplace_back(std::move(value));
  return result;
}